

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

Buffer * __thiscall Potassco::StringBuilder::grow(StringBuilder *this,size_t n)

{
  byte bVar1;
  uint8_t uVar2;
  ulong extraout_RAX;
  int *piVar3;
  string *this_00;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  ulong in_RDX;
  Buffer *in_RSI;
  Buffer *__ptr;
  Buffer *in_RDI;
  Buffer *ret;
  Buffer current;
  StringBuilder temp;
  Type bft;
  Buffer *this_01;
  ulong local_98;
  StringBuilder *in_stack_ffffffffffffff70;
  anon_union_64_3_812e3e79_for_StringBuilder_0 local_70;
  char *local_30;
  size_t local_28;
  size_t local_20;
  Type local_14;
  ulong local_10;
  
  __ptr = in_RSI;
  this_01 = in_RDI;
  local_10 = in_RDX;
  local_14 = type((StringBuilder *)0x13fe03);
  if ((local_14 == Sbo) && (bVar1 = tag((StringBuilder *)in_RSI), local_10 <= bVar1)) {
    buffer(in_stack_ffffffffffffff70);
    this_01->head = local_30;
    this_01->used = local_28;
    this_01->size = local_20;
    uVar2 = tag((StringBuilder *)in_RSI);
    setTag((StringBuilder *)in_RSI,uVar2 - (char)local_10);
  }
  else if ((local_14 == Buf) &&
          ((Buffer::free(in_RSI,__ptr), local_10 <= extraout_RAX ||
           (bVar1 = tag((StringBuilder *)in_RSI), (bVar1 & 1) == 0)))) {
    this_01->head = in_RSI->head;
    this_01->used = in_RSI->used;
    this_01->size = in_RSI->size;
    local_10 = local_10 + in_RSI->used;
    in_RSI->used = local_10;
    if (in_RSI->size < local_10) {
      piVar3 = __errno_location();
      *piVar3 = 0x22;
      in_RSI->used = in_RSI->size;
    }
  }
  else {
    if (local_14 != Str) {
      StringBuilder((StringBuilder *)0x13ff30);
      this_00 = (string *)operator_new(0x20);
      std::__cxx11::string::string((string *)this_00);
      local_70._0_8_ = this_00;
      setTag((StringBuilder *)&local_70.buf_,'A');
      buffer(in_stack_ffffffffffffff70);
      std::__cxx11::string::reserve((ulong)local_70.str_);
      std::__cxx11::string::append(local_70.buf_.head,local_98);
      uVar2 = tag((StringBuilder *)&local_70.buf_);
      setTag((StringBuilder *)in_RSI,uVar2);
      in_RSI->head = (char *)local_70.str_;
      local_70.str_ = (string *)0x0;
      ~StringBuilder((StringBuilder *)this_01);
    }
    std::__cxx11::string::append((ulong)in_RSI->head,(char)local_10);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI->head);
    this_01->head = pcVar4;
    lVar5 = std::__cxx11::string::size();
    this_01->used = lVar5 - local_10;
    sVar6 = std::__cxx11::string::size();
    this_01->size = sVar6;
  }
  return in_RDI;
}

Assistant:

StringBuilder::Buffer StringBuilder::grow(std::size_t n) {
	Buffer ret;
	Type bft = type();
	if (bft == Sbo && tag() >= n) {
		ret = buffer();
		setTag(static_cast<uint8_t>(tag() - n));
	}
	else if (bft == Buf && (buf_.free() >= n || (tag() & Own) == 0u)) {
		ret = buf_;
		if ((buf_.used += n) > buf_.size) {
			errno = ERANGE;
			buf_.used = buf_.size;
		}
	}
	else {
		if (bft != Str) {
			// switch to dynamic string-based buffer
			StringBuilder temp;
			temp.str_ = new std::string;
			temp.setTag(Str|Own);
			Buffer current = buffer();
			temp.str_->reserve(current.used + n);
			temp.str_->append(current.head, current.used);
			setTag(temp.tag());
			str_ = temp.str_;
			temp.str_ = 0;
		}
		str_->append(n, '\0');
		ret.head = const_cast<char*>(&str_->operator[](0));
		ret.used = str_->size() - n;
		ret.size = str_->size();
	}
	return ret;
}